

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socksd.c
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  uchar uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  int *piVar13;
  char *pcVar14;
  uint *puVar15;
  long lVar16;
  FILE *__stream;
  size_t sVar17;
  ssize_t sVar18;
  ushort connectport;
  unsigned_short uVar19;
  socklen_t __len;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  int iVar23;
  char cVar24;
  ulong uVar25;
  undefined8 uVar26;
  ulong __n;
  char key [32];
  curl_socklen_t la_size;
  uchar buffer [272];
  fd_set fds_err;
  fd_set fds_write;
  int flag;
  char *endptr;
  char *local_678;
  undefined4 local_668;
  char cStack_664;
  undefined2 uStack_663;
  undefined1 uStack_661;
  int local_660;
  undefined1 uStack_65c;
  uint auStack_650 [2];
  long local_648 [2];
  uint local_638 [2];
  ulong auStack_630 [5];
  char local_608 [40];
  ulong local_5e0;
  fd_set local_5d8;
  sockaddr local_558 [17];
  fd_set local_448;
  fd_set local_3c8;
  undefined4 local_348;
  undefined2 local_344 [134];
  sockaddr local_238;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  
  if (argc < 2) {
    local_678 = ".socksd.pid";
  }
  else {
    local_678 = ".socksd.pid";
    iVar7 = 1;
    do {
      pcVar14 = argv[iVar7];
      iVar5 = strcmp("--version",pcVar14);
      if (iVar5 == 0) {
        curl_mprintf("socksd IPv4%s\n","/IPv6");
        return 0;
      }
      iVar5 = strcmp("--pidfile",pcVar14);
      if (iVar5 == 0) {
        iVar23 = iVar7 + 1;
        iVar5 = iVar23;
        if (iVar23 < argc) {
          iVar5 = iVar7 + 2;
          local_678 = argv[iVar23];
        }
      }
      else {
        iVar5 = strcmp("--config",pcVar14);
        if (iVar5 == 0) {
          iVar23 = iVar7 + 1;
          iVar5 = iVar23;
          if (iVar23 < argc) {
            iVar5 = iVar7 + 2;
            configfile = argv[iVar23];
          }
        }
        else {
          iVar5 = strcmp("--backend",pcVar14);
          if (iVar5 == 0) {
            iVar23 = iVar7 + 1;
            iVar5 = iVar23;
            if (iVar23 < argc) {
              iVar5 = iVar7 + 2;
              backendaddr = argv[iVar23];
            }
          }
          else {
            iVar5 = strcmp("--backendport",pcVar14);
            if (iVar5 == 0) {
              iVar23 = iVar7 + 1;
              iVar5 = iVar23;
              if (iVar23 < argc) {
                iVar5 = iVar7 + 2;
                iVar7 = atoi(argv[iVar23]);
                backendport = (unsigned_short)iVar7;
              }
            }
            else {
              iVar5 = strcmp("--logfile",pcVar14);
              if (iVar5 == 0) {
                iVar23 = iVar7 + 1;
                iVar5 = iVar23;
                if (iVar23 < argc) {
                  iVar5 = iVar7 + 2;
                  serverlogfile = argv[iVar23];
                }
              }
              else {
                iVar5 = strcmp("--ipv6",pcVar14);
                if (iVar5 == 0) {
                  ipv_inuse = "IPv6";
                  use_ipv6 = 1;
                }
                else {
                  iVar5 = strcmp("--ipv4",pcVar14);
                  if (iVar5 != 0) {
                    iVar5 = strcmp("--port",pcVar14);
                    if (iVar5 != 0) {
                      puts(
                          "Usage: socksd [option]\n --backend [ipv4 addr]\n --backendport [TCP port]\n --config [file]\n --version\n --logfile [file]\n --pidfile [file]\n --ipv4\n --ipv6\n --bindonly\n --port [port]\n"
                          );
                      return 0;
                    }
                    iVar5 = iVar7 + 1;
                    if (iVar5 < argc) {
                      uVar11 = strtoul(argv[iVar5],(char **)&local_238,10);
                      uVar26 = local_238._0_8_;
                      pcVar14 = argv[iVar5];
                      sVar12 = strlen(pcVar14);
                      if (((char *)uVar26 == pcVar14 + sVar12) &&
                         (0xffffffffffff0400 < uVar11 - 0x10000 || uVar11 == 0)) {
                        port = curlx_ultous(uVar11);
                        iVar5 = iVar7 + 2;
                        bVar3 = true;
                      }
                      else {
                        bVar3 = false;
                        curl_mfprintf(_stderr,"socksd: invalid --port argument (%s)\n",pcVar14);
                      }
                      if (!bVar3) {
                        return 0;
                      }
                    }
                    goto LAB_00105318;
                  }
                  ipv_inuse = "IPv4";
                  use_ipv6 = 0;
                }
                iVar5 = iVar7 + 1;
              }
            }
          }
        }
      }
LAB_00105318:
      iVar7 = iVar5;
    } while (iVar5 < argc);
  }
  old_sighup_handler = (SIGHANDLER_T)signal(1,(__sighandler_t)0x1);
  if (old_sighup_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar13 = __errno_location();
    pcVar14 = strerror(*piVar13);
    logmsg("cannot install SIGHUP handler: %s",pcVar14);
  }
  old_sigpipe_handler = (SIGHANDLER_T)signal(0xd,(__sighandler_t)0x1);
  if (old_sigpipe_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar13 = __errno_location();
    pcVar14 = strerror(*piVar13);
    logmsg("cannot install SIGPIPE handler: %s",pcVar14);
  }
  old_sigalrm_handler = (SIGHANDLER_T)signal(0xe,(__sighandler_t)0x1);
  if (old_sigalrm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar13 = __errno_location();
    pcVar14 = strerror(*piVar13);
    logmsg("cannot install SIGALRM handler: %s",pcVar14);
  }
  old_sigint_handler = (SIGHANDLER_T)signal(2,exit_signal_handler);
  if (old_sigint_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar13 = __errno_location();
    pcVar14 = strerror(*piVar13);
    logmsg("cannot install SIGINT handler: %s",pcVar14);
  }
  else {
    siginterrupt(2,1);
  }
  uVar6 = socket((uint)use_ipv6 * 8 + 2,1,0);
  if (uVar6 == 0xffffffff) {
    puVar15 = (uint *)__errno_location();
    uVar6 = *puVar15;
    pcVar14 = strerror(uVar6);
    logmsg("Error creating socket: (%d) %s",(ulong)uVar6,pcVar14);
    iVar7 = -1;
    bVar3 = true;
    goto LAB_001064c6;
  }
  uVar11 = (ulong)uVar6;
  local_348 = 1;
  iVar7 = setsockopt(uVar6,1,2,&local_348,4);
  if (iVar7 == 0) {
LAB_00105553:
    if (use_ipv6 == 0) {
      local_238.sa_data[6] = '\0';
      local_238.sa_data[7] = '\0';
      local_238.sa_data[8] = '\0';
      local_238.sa_data[9] = '\0';
      local_238.sa_data[10] = '\0';
      local_238.sa_data[0xb] = '\0';
      local_238.sa_data[0xc] = '\0';
      local_238.sa_data[0xd] = '\0';
      local_238.sa_family = 2;
      __len = 0x10;
    }
    else {
      uStack_220 = 0;
      local_238.sa_family = 10;
      local_238.sa_data._6_4_ = SUB84(_in6addr_any,0);
      local_238.sa_data._10_4_ = SUB84((ulong)_in6addr_any >> 0x20,0);
      uStack_228 = (undefined4)_poll;
      uStack_224 = (undefined4)((ulong)_poll >> 0x20);
      __len = 0x1c;
    }
    local_238.sa_data._0_2_ = port << 8 | port >> 8;
    local_238.sa_data._2_4_ = 0;
    iVar7 = bind(uVar6,&local_238,__len);
    if (iVar7 != 0) {
      puVar15 = (uint *)__errno_location();
      uVar19 = port;
      uVar10 = *puVar15;
      pcVar14 = strerror(uVar10);
      pcVar21 = "Error binding socket on port %hu: (%d) %s";
      uVar11 = (ulong)uVar19;
LAB_00105631:
      logmsg(pcVar21,uVar11,(ulong)uVar10,pcVar14);
      goto LAB_0010563d;
    }
    if (port == 0) {
      sVar12 = 0x10;
      if (use_ipv6 != 0) {
        sVar12 = 0x1c;
      }
      local_5d8.fds_bits[0] = CONCAT44(local_5d8.fds_bits[0]._4_4_,(int)sVar12);
      memset(local_558,0,sVar12);
      iVar7 = getsockname(uVar6,local_558,(socklen_t *)&local_5d8);
      if (iVar7 < 0) {
        puVar15 = (uint *)__errno_location();
        uVar10 = *puVar15;
        pcVar14 = strerror(uVar10);
        pcVar21 = "getsockname() failed with error: (%d) %s";
        goto LAB_001054de;
      }
      if ((local_558[0].sa_family | 8) == 10) {
        port = local_558[0].sa_data._0_2_ << 8 | (ushort)local_558[0].sa_data._0_2_ >> 8;
      }
      if (port == 0) {
        logmsg("Apparently getsockname() succeeded, with listener port zero.");
        logmsg("A valid reason for this failure is a binary built without");
        logmsg("proper network library linkage. This might not be the only");
        pcVar14 = "reason, but double check it before anything else.";
        goto LAB_00105547;
      }
    }
    iVar7 = listen(uVar6,5);
    if (iVar7 != 0) {
      puVar15 = (uint *)__errno_location();
      uVar10 = *puVar15;
      pcVar14 = strerror(uVar10);
      pcVar21 = "listen(%d, 5) failed with error: (%d) %s";
      goto LAB_00105631;
    }
  }
  else {
    puVar15 = (uint *)__errno_location();
    uVar10 = *puVar15;
    pcVar14 = strerror(uVar10);
    logmsg("setsockopt(SO_REUSEADDR) failed with error: (%d) %s",(ulong)uVar10,pcVar14);
    iVar7 = wait_ms(0x14);
    if (iVar7 == 0) {
      if (got_exit_signal == 0) goto LAB_00105553;
      pcVar14 = "signalled to die, exiting...";
LAB_00105547:
      logmsg(pcVar14);
    }
    else {
      uVar10 = *puVar15;
      pcVar14 = strerror(uVar10);
      pcVar21 = "wait_ms() failed with error: (%d) %s";
LAB_001054de:
      logmsg(pcVar21,(ulong)uVar10,pcVar14);
    }
LAB_0010563d:
    close(uVar6);
    uVar11 = 0xffffffff;
  }
  bVar3 = true;
  iVar7 = (int)uVar11;
  if (iVar7 == -1) {
    iVar7 = -1;
  }
  else {
    logmsg("Running %s version",ipv_inuse);
    logmsg("Listening on port %hu",(ulong)port);
    iVar5 = write_pidfile(local_678);
    if (iVar5 != 0) {
      iVar5 = iVar7 + 0x3f;
      if (-1 < iVar7) {
        iVar5 = iVar7;
      }
      uVar20 = 1L << ((byte)uVar11 & 0x3f);
LAB_001056bf:
      auStack_630[3] = 0;
      auStack_630[4] = 0;
      auStack_630[1] = 0;
      auStack_630[2] = 0;
      local_638[0] = 0;
      local_638[1] = 0;
      auStack_630[0] = 0;
      local_648[0] = 0;
      local_648[1] = 0;
      if (got_exit_signal == 0) {
        iVar23 = 0;
LAB_001056e6:
        local_5d8.fds_bits[0xe] = 0;
        local_5d8.fds_bits[0xf] = 0;
        local_5d8.fds_bits[0xc] = 0;
        local_5d8.fds_bits[0xd] = 0;
        local_5d8.fds_bits[10] = 0;
        local_5d8.fds_bits[0xb] = 0;
        local_5d8.fds_bits[8] = 0;
        local_5d8.fds_bits[9] = 0;
        local_5d8.fds_bits[6] = 0;
        local_5d8.fds_bits[7] = 0;
        local_5d8.fds_bits[4] = 0;
        local_5d8.fds_bits[5] = 0;
        local_5d8.fds_bits[2] = 0;
        local_5d8.fds_bits[3] = 0;
        local_5d8.fds_bits[0] = 0;
        local_5d8.fds_bits[1] = 0;
        local_3c8.fds_bits[0] = 0;
        local_3c8.fds_bits[1] = 0;
        local_3c8.fds_bits[2] = 0;
        local_3c8.fds_bits[3] = 0;
        local_3c8.fds_bits[4] = 0;
        local_3c8.fds_bits[5] = 0;
        local_3c8.fds_bits[6] = 0;
        local_3c8.fds_bits[7] = 0;
        local_3c8.fds_bits[8] = 0;
        local_3c8.fds_bits[9] = 0;
        local_3c8.fds_bits[10] = 0;
        local_3c8.fds_bits[0xb] = 0;
        local_3c8.fds_bits[0xc] = 0;
        local_3c8.fds_bits[0xd] = 0;
        local_3c8.fds_bits[0xe] = 0;
        local_3c8.fds_bits[0xf] = 0;
        local_448.fds_bits[0] = 0;
        local_448.fds_bits[1] = 0;
        local_448.fds_bits[2] = 0;
        local_448.fds_bits[3] = 0;
        local_448.fds_bits[4] = 0;
        local_448.fds_bits[5] = 0;
        local_448.fds_bits[6] = 0;
        local_448.fds_bits[7] = 0;
        local_448.fds_bits[8] = 0;
        local_448.fds_bits[9] = 0;
        local_448.fds_bits[10] = 0;
        local_448.fds_bits[0xb] = 0;
        local_5d8.fds_bits[iVar5 >> 6] = local_5d8.fds_bits[iVar5 >> 6] | uVar20;
        local_448.fds_bits[0xc] = 0;
        local_448.fds_bits[0xd] = 0;
        local_448.fds_bits[0xe] = 0;
        local_448.fds_bits[0xf] = 0;
        lVar16 = 0x18;
        uVar25 = uVar11;
        do {
          if (*(char *)((long)local_648 + lVar16) == '\x01') {
            uVar6 = *(uint *)((long)auStack_650 + lVar16 + 4);
            uVar10 = uVar6 + 0x3f;
            if (-1 < (int)uVar6) {
              uVar10 = uVar6;
            }
            uVar9 = *(uint *)((long)auStack_650 + lVar16);
            local_5d8.fds_bits[(int)uVar10 >> 6] =
                 local_5d8.fds_bits[(int)uVar10 >> 6] | 1L << ((byte)uVar6 & 0x3f);
            uVar10 = (uint)uVar25;
            if ((int)(uint)uVar25 < (int)uVar6) {
              uVar10 = uVar6;
            }
            uVar6 = uVar9 + 0x3f;
            if (-1 < (int)uVar9) {
              uVar6 = uVar9;
            }
            local_5d8.fds_bits[(int)uVar6 >> 6] =
                 local_5d8.fds_bits[(int)uVar6 >> 6] | 1L << ((byte)uVar9 & 0x3f);
            uVar25 = (ulong)uVar10;
            if ((int)uVar10 < (int)uVar9) {
              uVar25 = (ulong)uVar9;
            }
          }
          lVar16 = lVar16 + 0x20;
        } while (lVar16 == 0x38);
        uVar6 = 0;
        do {
          iVar8 = select((int)uVar25 + 1,&local_5d8,&local_3c8,&local_448,(timeval *)0x0);
          if (got_exit_signal != 0) {
            logmsg("signalled to die, exiting...");
            goto LAB_00105c83;
          }
          uVar10 = uVar6;
          if (iVar8 != -1) break;
          puVar15 = (uint *)__errno_location();
          uVar10 = *puVar15;
          uVar6 = 4;
        } while (uVar10 == 4);
        if (-1 < iVar8) {
          if ((iVar23 < 2) && ((local_5d8.fds_bits[iVar5 >> 6] & uVar20) != 0)) {
            uVar6 = accept(iVar7,(sockaddr *)0x0,(socklen_t *)0x0);
            if (uVar6 == 0xffffffff) {
              puVar15 = (uint *)__errno_location();
              uVar6 = *puVar15;
              strerror(uVar6);
              logmsg("accept(%d, NULL, NULL) failed with error: (%d) %s",uVar11,(ulong)uVar6);
              goto LAB_00105c93;
            }
            logmsg("====> Client connect, fd %d. Read config from %s",(ulong)uVar6,configfile);
            __stream = fopen64(configfile,"r");
            logmsg("Reset to defaults");
            config.version = '\x05';
            config.nmethods_min = '\x01';
            config.nmethods_max = '\x03';
            config.responseversion = '\x05';
            config.responsemethod = '\0';
            config.reqcmd = '\x01';
            config.connectrep = '\0';
            config.port = backendport;
            strcpy(config.addr,backendaddr);
            builtin_strncpy(config.user,"user",5);
            builtin_strncpy(config.password,"password",9);
            if (__stream != (FILE *)0x0) {
              logmsg("parse config file");
LAB_001059ab:
              do {
                pcVar14 = fgets((char *)&local_238,0x200,__stream);
                if (pcVar14 == (char *)0x0) goto LAB_00105da3;
                iVar8 = __isoc99_sscanf(&local_238,"%31s %31s",&local_668);
              } while (iVar8 != 2);
              lVar16 = CONCAT17(uStack_661,CONCAT25(uStack_663,CONCAT14(cStack_664,local_668)));
              if (lVar16 == 0x6e6f6973726576) {
                uVar25 = strtoul(local_608,(char **)0x0,10);
                config.version = (uchar)uVar25;
                uVar25 = uVar25 & 0xff;
                pcVar14 = "version [%d] set";
              }
              else if (CONCAT17(uStack_65c,CONCAT43(local_660,CONCAT12(uStack_661,uStack_663))) ==
                       0x6e696d5f73646f &&
                       CONCAT17(uStack_661,CONCAT25(uStack_663,CONCAT14(cStack_664,local_668))) ==
                       0x73646f6874656d6e) {
                uVar25 = strtoul(local_608,(char **)0x0,10);
                config.nmethods_min = (uchar)uVar25;
                uVar25 = uVar25 & 0xff;
                pcVar14 = "nmethods_min [%d] set";
              }
              else {
                if (CONCAT17(uStack_65c,CONCAT43(local_660,CONCAT12(uStack_661,uStack_663))) !=
                    0x78616d5f73646f ||
                    CONCAT17(uStack_661,CONCAT25(uStack_663,CONCAT14(cStack_664,local_668))) !=
                    0x73646f6874656d6e) {
                  if (lVar16 == 0x646e656b636162) {
                    uVar26 = 0x10a626;
                    strcpy(config.addr,local_608);
                    pcVar14 = "backend [%s] set";
                  }
                  else {
                    if (local_660 == 0x74726f &&
                        CONCAT17(uStack_661,CONCAT25(uStack_663,CONCAT14(cStack_664,local_668))) ==
                        0x70646e656b636162) {
                      uVar25 = strtoul(local_608,(char **)0x0,10);
                      config.port = (unsigned_short)uVar25;
                      uVar25 = uVar25 & 0xffff;
                      pcVar14 = "backendport [%d] set";
                      goto LAB_00105bdb;
                    }
                    if (cStack_664 == '\0' && local_668 == 0x72657375) {
                      uVar26 = 0x10a646;
                      strcpy(config.user,local_608);
                      pcVar14 = "user [%s] set";
                    }
                    else {
                      if ((char)local_660 != '\0' ||
                          CONCAT17(uStack_661,CONCAT25(uStack_663,CONCAT14(cStack_664,local_668)))
                          != 0x64726f7773736170) {
                        if (CONCAT22(uStack_663,CONCAT11(cStack_664,local_668._3_1_)) != 0x646f68 ||
                            local_668 != 0x6874656d) {
                          if ((char)local_660 == '\0' &&
                              CONCAT17(uStack_661,
                                       CONCAT25(uStack_663,CONCAT14(cStack_664,local_668))) ==
                              0x65736e6f70736572) {
                            uVar25 = strtoul(local_608,(char **)0x0,10);
                            config.connectrep = (uchar)uVar25;
                            uVar25 = uVar25 & 0xff;
                            pcVar14 = "response [%d] set";
                            goto LAB_00105bdb;
                          }
                          goto LAB_001059ab;
                        }
                        uVar25 = strtoul(local_608,(char **)0x0,10);
                        config.responsemethod = (uchar)uVar25;
                        uVar25 = uVar25 & 0xff;
                        pcVar14 = "method [%d] set";
                        goto LAB_00105bdb;
                      }
                      uVar26 = 0x10a746;
                      strcpy(config.password,local_608);
                      pcVar14 = "password [%s] set";
                    }
                  }
                  logmsg(pcVar14,uVar26);
                  goto LAB_001059ab;
                }
                uVar25 = strtoul(local_608,(char **)0x0,10);
                config.nmethods_max = (uchar)uVar25;
                uVar25 = uVar25 & 0xff;
                pcVar14 = "nmethods_max [%d] set";
              }
LAB_00105bdb:
              logmsg(pcVar14,uVar25);
              goto LAB_001059ab;
            }
            goto LAB_00105daf;
          }
          goto LAB_00105c93;
        }
        pcVar14 = strerror(uVar10);
        logmsg("select() failed with error: (%d) %s",(ulong)uVar10,pcVar14);
LAB_00105c83:
        bVar3 = false;
        goto LAB_00105d8c;
      }
      bVar3 = false;
      logmsg("signalled to die, exiting...");
    }
  }
LAB_001064c6:
  if (iVar7 != -1) {
    close(iVar7);
  }
  if (!bVar3) {
    unlink(local_678);
  }
  if (old_sighup_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(1,(__sighandler_t)old_sighup_handler);
  }
  if (old_sigpipe_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xd,(__sighandler_t)old_sigpipe_handler);
  }
  if (old_sigalrm_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(0xe,(__sighandler_t)old_sigalrm_handler);
  }
  if (old_sigint_handler != (SIGHANDLER_T)0xffffffffffffffff) {
    signal(2,(__sighandler_t)old_sigint_handler);
  }
  if (got_exit_signal != 0) {
    logmsg("============> socksd exits with signal (%d)",(ulong)(uint)exit_signal);
    raise(exit_signal);
  }
  logmsg("============> socksd quits");
  return 0;
LAB_00105da3:
  fclose(__stream);
LAB_00105daf:
  sVar18 = recv(uVar6,local_558,0x110,0);
  logmsg("READ %d bytes",sVar18);
  loghex((uchar *)local_558,sVar18);
  if ((uchar)local_558[0].sa_family == '\x04') {
    pcVar14 = (char *)(ulong)local_558[0].sa_family._1_1_;
    if (local_558[0].sa_family._1_1_ != 1) {
      pcVar21 = "SOCKS4 CD is not 1: %d";
      goto LAB_00105eb9;
    }
    if (8 < sVar18) {
      connectport = local_558[0].sa_data._0_2_ << 8 | (ushort)local_558[0].sa_data._0_2_ >> 8;
      if (config.port != 0) {
        connectport = config.port;
      }
      uVar10 = socksconnect(connectport,pcVar14);
      local_238._0_8_ =
           (ulong)CONCAT25(local_558[0].sa_data._4_2_,
                           CONCAT41(local_558[0].sa_data._0_4_,uVar10 == 0xffffffff)) << 8 | 0x5a00;
      sVar18 = send(uVar6,&local_238,8,0);
      if (sVar18 == 8) {
        logmsg("Sent %d bytes",8);
        loghex((uchar *)&local_238,8);
        goto LAB_00105ec6;
      }
      pcVar14 = "Sending SOCKS4 response failed!";
LAB_001060ae:
      logmsg(pcVar14);
      goto LAB_00105ec0;
    }
    pcVar14 = "SOCKS4 connect message too short: %d";
LAB_00105e20:
    logmsg(pcVar14,sVar18);
  }
  else {
    pcVar14 = (char *)(ulong)config.version;
    if ((uchar)local_558[0].sa_family != config.version) {
      pcVar21 = "VERSION byte not %d";
      goto LAB_00105eb9;
    }
    if (config.nmethods_max < local_558[0].sa_family._1_1_ ||
        local_558[0].sa_family._1_1_ < config.nmethods_min) {
      logmsg("NMETHODS byte not within %d - %d ",(ulong)config.nmethods_min,
             (ulong)config.nmethods_max);
    }
    else if (sVar18 == (ulong)local_558[0].sa_family._1_1_ + 2) {
      logmsg("Incoming request deemed fine!");
      local_348 = CONCAT22(local_348._2_2_,CONCAT11(config.responsemethod,config.responseversion));
      sVar18 = send(uVar6,&local_348,2,0);
      if (sVar18 != 2) {
        pcVar14 = "Sending response failed!";
        goto LAB_001060ae;
      }
      logmsg("Sent %d bytes",2);
      loghex((uchar *)&local_348,2);
      sVar18 = recv(uVar6,local_558,0x110,0);
      logmsg("READ %d bytes",sVar18);
      loghex((uchar *)local_558,sVar18);
      if (config.responsemethod == '\x02') {
        if (sVar18 < 5) {
          pcVar14 = "Too short auth input: %d";
LAB_0010607f:
          logmsg(pcVar14,sVar18);
LAB_00106106:
          bVar3 = false;
        }
        else {
          if ((uchar)local_558[0].sa_family != '\x01') {
            logmsg("Auth VERSION byte not 1, got %d");
            goto LAB_00106106;
          }
          uVar25 = (ulong)local_558[0].sa_family._1_1_;
          if (sVar18 < (long)(uVar25 + 4)) {
            pcVar14 = "Too short packet for username: %d";
            goto LAB_0010607f;
          }
          uVar22 = (ulong)(byte)local_558[0].sa_data[uVar25];
          if (sVar18 < (long)(ulong)((uint)(byte)local_558[0].sa_data[uVar25] +
                                    local_558[0].sa_family._1_1_ + 3)) {
            logmsg("Too short packet for ulen %d plen %d: %d",uVar25,uVar22);
            goto LAB_00106106;
          }
          __n = (ulong)local_558[0].sa_family._1_1_;
          sVar12 = strlen(config.user);
          if ((((sVar12 == __n) && (sVar12 = strlen(config.password), sVar12 == uVar22)) &&
              (iVar8 = bcmp(local_558[0].sa_data,config.user,__n), iVar8 == 0)) &&
             (iVar8 = bcmp(local_558[0].sa_data + uVar25 + 1,config.password,uVar22), iVar8 == 0)) {
            cVar24 = '\x01';
          }
          else {
            cVar24 = '\0';
            logmsg("mismatched credentials!");
          }
          local_348 = CONCAT22(local_348._2_2_,CONCAT11(cVar24,1)) ^ 0x100;
          sVar18 = send(uVar6,&local_348,2,0);
          if (sVar18 == 2) {
            sVar18 = 2;
            logmsg("Sent %d bytes",2);
            loghex((uchar *)&local_348,2);
            bVar3 = false;
            if (cVar24 != '\0') {
              sVar18 = recv(uVar6,local_558,0x110,0);
              logmsg("READ %d bytes",sVar18);
              loghex((uchar *)local_558,sVar18);
              bVar3 = true;
            }
          }
          else {
            logmsg("Sending auth response failed!");
            bVar3 = false;
          }
        }
        uVar10 = 0xffffffff;
        if (!bVar3) goto LAB_00105ec6;
      }
      if (sVar18 < 6) {
        pcVar14 = "Too short for request: %d";
        goto LAB_00105e20;
      }
      pcVar14 = (char *)(ulong)config.version;
      if ((uchar)local_558[0].sa_family == config.version) {
        pcVar14 = (char *)(ulong)config.reqcmd;
        if ((local_558[0].sa_family._1_1_ == config.reqcmd) && (local_558[0].sa_data[0] == '\0')) {
          cVar24 = local_558[0].sa_data[1];
          if (local_558[0].sa_data[1] == 1) {
            bVar4 = 4;
          }
          else if (local_558[0].sa_data[1] == 4) {
            bVar4 = 0x10;
          }
          else {
            if ((byte)local_558[0].sa_data[1] != 3) {
              pcVar21 = "Unknown ATYP %d";
              pcVar14 = (char *)(ulong)(uint)(byte)local_558[0].sa_data[1];
              goto LAB_00105eb9;
            }
            bVar4 = local_558[0].sa_data[2] + 1;
          }
          uVar22 = (ulong)bVar4;
          uVar25 = (ulong)(bVar4 + 6);
          if ((long)uVar25 <= sVar18) {
            uVar19 = config.port;
            if (config.port == 0) {
              uVar19 = *(ushort *)(local_558[0].sa_data + uVar22 + 2) << 8 |
                       *(ushort *)(local_558[0].sa_data + uVar22 + 2) >> 8;
            }
            uVar10 = 0xffffffff;
            local_5e0 = uVar25;
            if (config.connectrep == '\0') {
              uVar10 = socksconnect(uVar19,pcVar14);
            }
            uVar2 = config.connectrep;
            if (uVar10 == 0xffffffff) {
              uVar2 = '\x01';
            }
            local_348._0_3_ = (uint3)CONCAT11(uVar2,config.responseversion);
            local_348 = CONCAT13(cVar24,(uint3)local_348);
            memcpy(local_344,local_558[0].sa_data + 2,uVar22);
            uVar25 = local_5e0;
            *(undefined2 *)((long)local_344 + uVar22) =
                 *(undefined2 *)(local_558[0].sa_data + uVar22 + 2);
            sVar12 = send(uVar6,&local_348,local_5e0,0);
            if (sVar12 == uVar25) {
              logmsg("Sent %d bytes",sVar12);
              loghex((uchar *)&local_348,sVar12);
              if (uVar2 == '\0' || uVar10 == 0xffffffff) {
                uVar10 = -(uint)(uVar2 != '\0') | uVar10;
                goto LAB_00105ec6;
              }
              close(uVar10);
            }
            else {
              logmsg("Sending connect response failed!");
            }
            uVar10 = 0xffffffff;
            goto LAB_00105ec6;
          }
          logmsg("Request too short: %d, expected %d",sVar18);
          goto LAB_00105ec0;
        }
        pcVar21 = "Request COMMAND byte not %d";
      }
      else {
        pcVar21 = "Request VERSION byte not %d";
      }
LAB_00105eb9:
      logmsg(pcVar21,pcVar14);
    }
    else {
      logmsg("Expected %d bytes, got %d",(ulong)local_558[0].sa_family._1_1_ + 2,sVar18);
    }
  }
LAB_00105ec0:
  uVar10 = 0xffffffff;
LAB_00105ec6:
  if (uVar10 == 0xffffffff) {
    logmsg("====> Client disconnect");
    close(uVar6);
  }
  else {
    logmsg("====> Tunnel transfer");
    uVar25 = auStack_630[0] & 0xff;
    local_648[uVar25 * 4] = 0;
    local_648[uVar25 * 4 + 1] = 0;
    local_638[uVar25 * 8 + 1] = uVar6;
    local_638[uVar25 * 8] = uVar10;
    *(undefined1 *)(auStack_630 + uVar25 * 4) = 1;
    iVar23 = iVar23 + 1;
  }
LAB_00105c93:
  lVar16 = 0;
  do {
    if (*(char *)((long)auStack_630 + lVar16) == '\x01') {
      uVar6 = *(uint *)((long)local_638 + lVar16 + 4);
      uVar10 = uVar6 + 0x3f;
      if (-1 < (int)uVar6) {
        uVar10 = uVar6;
      }
      if (((ulong)local_5d8.fds_bits[(int)uVar10 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
LAB_00105cf8:
        uVar10 = *(uint *)((long)local_638 + lVar16);
        uVar9 = uVar10 + 0x3f;
        if (-1 < (int)uVar10) {
          uVar9 = uVar10;
        }
        if (((ulong)local_5d8.fds_bits[(int)uVar9 >> 6] >> ((ulong)uVar10 & 0x3f) & 1) != 0) {
          sVar12 = recv(uVar10,&local_238,0x200,0);
          if (((long)sVar12 < 1) || (sVar17 = send(uVar6,&local_238,sVar12,0), sVar17 != sVar12))
          goto LAB_00105d4a;
          *(long *)((long)local_648 + lVar16) = *(long *)((long)local_648 + lVar16) + sVar17;
        }
      }
      else {
        sVar12 = recv(uVar6,&local_238,0x200,0);
        if ((0 < (long)sVar12) &&
           (sVar17 = send(*(int *)((long)local_638 + lVar16),&local_238,sVar12,0), sVar17 == sVar12)
           ) {
          plVar1 = (long *)((long)local_648 + lVar16 + 8);
          *plVar1 = *plVar1 + sVar17;
          goto LAB_00105cf8;
        }
LAB_00105d4a:
        logmsg("SOCKS transfer completed. Bytes: < %zu > %zu",
               *(undefined8 *)((long)local_648 + lVar16),
               *(undefined8 *)((long)local_648 + lVar16 + 8));
        close(uVar6);
        close(*(int *)((long)local_638 + lVar16));
        *(undefined1 *)((long)auStack_630 + lVar16) = 0;
        iVar23 = iVar23 + -1;
      }
    }
    lVar16 = lVar16 + 0x20;
  } while (lVar16 == 0x20);
  bVar3 = true;
LAB_00105d8c:
  if ((!bVar3) || (iVar23 == 0)) goto LAB_001064a1;
  goto LAB_001056e6;
LAB_001064a1:
  if (!bVar3) goto code_r0x001064aa;
  goto LAB_001056bf;
code_r0x001064aa:
  bVar3 = false;
  goto LAB_001064c6;
}

Assistant:

int main(int argc, char *argv[])
{
  curl_socket_t sock = CURL_SOCKET_BAD;
  curl_socket_t msgsock = CURL_SOCKET_BAD;
  int wrotepidfile = 0;
  const char *pidname = ".socksd.pid";
  bool juggle_again;
  int error;
  int arg = 1;

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("socksd IPv4%s\n",
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--pidfile", argv[arg])) {
      arg++;
      if(argc>arg)
        pidname = argv[arg++];
    }
    else if(!strcmp("--config", argv[arg])) {
      arg++;
      if(argc>arg)
        configfile = argv[arg++];
    }
    else if(!strcmp("--backend", argv[arg])) {
      arg++;
      if(argc>arg)
        backendaddr = argv[arg++];
    }
    else if(!strcmp("--backendport", argv[arg])) {
      arg++;
      if(argc>arg)
        backendport = (unsigned short)atoi(argv[arg++]);
    }
    else if(!strcmp("--logfile", argv[arg])) {
      arg++;
      if(argc>arg)
        serverlogfile = argv[arg++];
    }
    else if(!strcmp("--ipv6", argv[arg])) {
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
#endif
      arg++;
    }
    else if(!strcmp("--ipv4", argv[arg])) {
      /* for completeness, we support this option as well */
#ifdef ENABLE_IPV6
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
#endif
      arg++;
    }
    else if(!strcmp("--port", argv[arg])) {
      arg++;
      if(argc>arg) {
        char *endptr;
        unsigned long ulnum = strtoul(argv[arg], &endptr, 10);
        if((endptr != argv[arg] + strlen(argv[arg])) ||
           ((ulnum != 0UL) && ((ulnum < 1025UL) || (ulnum > 65535UL)))) {
          fprintf(stderr, "socksd: invalid --port argument (%s)\n",
                  argv[arg]);
          return 0;
        }
        port = curlx_ultous(ulnum);
        arg++;
      }
    }
    else {
      puts("Usage: socksd [option]\n"
           " --backend [ipv4 addr]\n"
           " --backendport [TCP port]\n"
           " --config [file]\n"
           " --version\n"
           " --logfile [file]\n"
           " --pidfile [file]\n"
           " --ipv4\n"
           " --ipv6\n"
           " --bindonly\n"
           " --port [port]\n");
      return 0;
    }
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);

  setmode(fileno(stdin), O_BINARY);
  setmode(fileno(stdout), O_BINARY);
  setmode(fileno(stderr), O_BINARY);
#endif

  install_signal_handlers();

#ifdef ENABLE_IPV6
  if(!use_ipv6)
#endif
    sock = socket(AF_INET, SOCK_STREAM, 0);
#ifdef ENABLE_IPV6
  else
    sock = socket(AF_INET6, SOCK_STREAM, 0);
#endif

  if(CURL_SOCKET_BAD == sock) {
    error = SOCKERRNO;
    logmsg("Error creating socket: (%d) %s",
           error, strerror(error));
    goto socks5_cleanup;
  }

  {
    /* passive daemon style */
    sock = sockdaemon(sock, &port);
    if(CURL_SOCKET_BAD == sock) {
      goto socks5_cleanup;
    }
    msgsock = CURL_SOCKET_BAD; /* no stream socket yet */
  }

  logmsg("Running %s version", ipv_inuse);
  logmsg("Listening on port %hu", port);

  wrotepidfile = write_pidfile(pidname);
  if(!wrotepidfile) {
    goto socks5_cleanup;
  }

  do {
    juggle_again = incoming(sock);
  } while(juggle_again);

socks5_cleanup:

  if((msgsock != sock) && (msgsock != CURL_SOCKET_BAD))
    sclose(msgsock);

  if(sock != CURL_SOCKET_BAD)
    sclose(sock);

  if(wrotepidfile)
    unlink(pidname);

  restore_signal_handlers();

  if(got_exit_signal) {
    logmsg("============> socksd exits with signal (%d)", exit_signal);
    /*
     * To properly set the return status of the process we
     * must raise the same signal SIGINT or SIGTERM that we
     * caught and let the old handler take care of it.
     */
    raise(exit_signal);
  }

  logmsg("============> socksd quits");
  return 0;
}